

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceSpec.cxx
# Opt level: O2

ReadFileResult anon_unknown.dwarf_36bfef::SocketHelper(Socket *out,Value *value)

{
  ReadFileResult RVar1;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
  sockets;
  
  sockets.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sockets.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sockets.
  super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RVar1 = std::
          function<cmCTestResourceSpec::ReadFileResult_(std::vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>_&,_const_Json::Value_*)>
          ::operator()((function<cmCTestResourceSpec::ReadFileResult_(std::vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>_&,_const_Json::Value_*)>
                        *)(anonymous_namespace)::SocketSetHelper_abi_cxx11_,&sockets,value);
  if (RVar1 == READ_OK) {
    if ((ulong)(((long)sockets.
                       super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)sockets.
                      super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 2) {
      if (sockets.
          super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          sockets.
          super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
                 *)out);
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>
                     *)out,&(sockets.
                             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t);
      }
      RVar1 = READ_OK;
    }
    else {
      RVar1 = INVALID_SOCKET_SPEC;
    }
  }
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_>_>
  ::~vector(&sockets);
  return RVar1;
}

Assistant:

cmCTestResourceSpec::ReadFileResult SocketHelper(
  cmCTestResourceSpec::Socket& out, const Json::Value* value)
{
  std::vector<
    std::map<std::string, std::vector<cmCTestResourceSpec::Resource>>>
    sockets;
  cmCTestResourceSpec::ReadFileResult result = SocketSetHelper(sockets, value);
  if (result != cmCTestResourceSpec::ReadFileResult::READ_OK) {
    return result;
  }
  if (sockets.size() > 1) {
    return cmCTestResourceSpec::ReadFileResult::INVALID_SOCKET_SPEC;
  }
  if (sockets.empty()) {
    out.Resources.clear();
  } else {
    out.Resources = std::move(sockets[0]);
  }
  return cmCTestResourceSpec::ReadFileResult::READ_OK;
}